

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinomialQueue.hpp
# Opt level: O3

size_t __thiscall
guts::BinomialQueue<int>::remove_sub(BinomialQueue<int> *this,size_t index,size_t prev)

{
  pointer pNVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar6 = index;
  do {
    uVar6 = (this->mNodes).
            super__Vector_base<guts::BinomialQueue<int>::Node,_std::allocator<guts::BinomialQueue<int>::Node>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar6].mRchild;
  } while (uVar6 < 0x80000000);
  if (uVar6 != 0xffffffffffffffff) {
    uVar6 = (ulong)((uint)uVar6 & 0x7fffffff);
    sVar4 = remove_sub(this,uVar6,prev);
    pNVar1 = (this->mNodes).
             super__Vector_base<guts::BinomialQueue<int>::Node,_std::allocator<guts::BinomialQueue<int>::Node>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar2 = pNVar1[uVar6].mLchild;
    while (sVar3 = sVar2, sVar3 != index) {
      sVar2 = pNVar1[sVar3].mRchild;
      pNVar1[sVar3].mRchild = sVar4;
      sVar4 = sVar3;
    }
    uVar5 = 0xffffffffffffffff;
    if (pNVar1[index].mRchild < 0x80000000) {
      uVar5 = pNVar1[index].mRchild;
    }
    pNVar1[uVar6].mLchild = uVar5;
    pNVar1[uVar6].mRchild = sVar4;
    prev = uVar6;
  }
  return prev;
}

Assistant:

size_t BinomialQueue<Key>::remove_sub(size_t index, size_t prev)
    { 
        size_t parent = mNodes[index].mRchild;
        while ((parent & PARENT_REF) == 0)
        {
            parent = mNodes[parent].mRchild;
        } 
                
        if (parent != NO_REF)
        {
            parent &= ~PARENT_REF;

            prev = remove_sub(parent, prev);

            size_t child = mNodes[parent].mLchild;
            
            while (child != index)
            {
                size_t next = mNodes[child].mRchild;
                mNodes[child].mRchild = prev;
                prev = child;
                child = next;
            }
            
            mNodes[parent].mLchild = (mNodes[index].mRchild & PARENT_REF) == 0 ? mNodes[index].mRchild : NO_REF;
            mNodes[parent].mRchild = prev;
            prev = parent;
        }

        return prev;
    }